

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O0

void __thiscall DeckBuilder::~DeckBuilder(DeckBuilder *this)

{
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar1;
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar2;
  bool bVar3;
  reference ppBVar4;
  reference ppGVar5;
  _Self local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<GreenCard_*> local_20;
  iterator it2;
  iterator it;
  DeckBuilder *this_local;
  
  std::_List_iterator<BlackCard_*>::_List_iterator((_List_iterator<BlackCard_*> *)&it2);
  std::_List_iterator<GreenCard_*>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(this->black);
  it2._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(this->black);
    bVar3 = std::operator!=((_Self *)&it2,&local_30);
    if (!bVar3) break;
    plVar1 = this->black;
    ppBVar4 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&it2);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove(plVar1,(char *)ppBVar4);
    ppBVar4 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&it2);
    if (*ppBVar4 != (BlackCard *)0x0) {
      (*((*ppBVar4)->super_Card)._vptr_Card[3])();
    }
    local_38 = (_List_node_base *)
               std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(this->black);
    it2._M_node = local_38;
    local_40 = (_List_node_base *)
               std::_List_iterator<BlackCard_*>::operator++((_List_iterator<BlackCard_*> *)&it2,0);
  }
  local_48 = (_List_node_base *)
             std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(this->green);
  local_20._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::end(this->green);
    bVar3 = std::operator!=(&local_20,&local_50);
    if (!bVar3) break;
    plVar2 = this->green;
    ppGVar5 = std::_List_iterator<GreenCard_*>::operator*(&local_20);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove(plVar2,(char *)ppGVar5);
    ppGVar5 = std::_List_iterator<GreenCard_*>::operator*(&local_20);
    if (*ppGVar5 != (GreenCard *)0x0) {
      (*((*ppGVar5)->super_Card)._vptr_Card[3])();
    }
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(this->green);
    std::_List_iterator<GreenCard_*>::operator++(&local_20,0);
  }
  plVar1 = this->black;
  if (plVar1 != (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)0x0) {
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::~list(plVar1);
    operator_delete(plVar1,0x18);
  }
  plVar2 = this->green;
  if (plVar2 != (list<GreenCard_*,_std::allocator<GreenCard_*>_> *)0x0) {
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::~list(plVar2);
    operator_delete(plVar2,0x18);
  }
  return;
}

Assistant:

DeckBuilder::~DeckBuilder()
{
	list<BlackCard *>::iterator it;
	list<GreenCard *>::iterator it2;

	for (it = black->begin(); it != black->end(); it++)
	{
		black->remove((*it));
		delete *it;
		it = black->begin();
	}
	for (it2 = green->begin(); it2 != green->end(); it2++)
	{
		green->remove((*it2));
		delete *it2;
		it2 = green->begin();
	}
	delete black;
	delete green;
}